

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void anon_unknown.dwarf_f4258f::getInstanceArrayDimensions
               (InstanceArraySymbol *array,SmallVectorBase<slang::ConstantRange> *dimensions)

{
  Scope *this;
  Symbol *pSVar1;
  InstanceArraySymbol *in_RSI;
  Symbol *in_RDI;
  Scope *scope;
  
  this = slang::ast::Symbol::getParentScope(in_RDI);
  if (this != (Scope *)0x0) {
    pSVar1 = slang::ast::Scope::asSymbol(this);
    if (pSVar1->kind == InstanceArray) {
      slang::ast::Scope::asSymbol(this);
      slang::ast::Symbol::as<slang::ast::InstanceArraySymbol>((Symbol *)0x6e0532);
      getInstanceArrayDimensions(in_RSI,(SmallVectorBase<slang::ConstantRange> *)this);
    }
  }
  slang::SmallVectorBase<slang::ConstantRange>::push_back
            ((SmallVectorBase<slang::ConstantRange> *)in_RSI,(ConstantRange *)this);
  return;
}

Assistant:

void getInstanceArrayDimensions(const InstanceArraySymbol& array,
                                SmallVectorBase<ConstantRange>& dimensions) {
    auto scope = array.getParentScope();
    if (scope && scope->asSymbol().kind == SymbolKind::InstanceArray)
        getInstanceArrayDimensions(scope->asSymbol().as<InstanceArraySymbol>(), dimensions);

    dimensions.push_back(array.range);
}